

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_OriginalOrder_Test::TestBody(TApp_OriginalOrder_Test *this)

{
  App *this_00;
  Option *pOVar1;
  Option *pOVar2;
  long lVar3;
  char *pcVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<CLI::Option_*> __l_01;
  allocator local_1f9;
  AssertionResult gtest_ar_2;
  allocator local_1e4;
  allocator local_1e3;
  allocator local_1e2;
  allocator local_1e1;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> st2;
  vector<int,_std::allocator<int>_> st1;
  _Vector_base<int,_std::allocator<int>_> local_190;
  Option *local_178;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  st1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  st1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  st1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_50,"-a",(allocator *)&local_190);
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)&st2);
  this_00 = &(this->super_TApp).app;
  pOVar1 = CLI::App::add_option<int>(this_00,&local_50,&st1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  st2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  st2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  st2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_90,"-b",(allocator *)&local_190);
  pcVar4 = "";
  std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&gtest_ar);
  pOVar2 = CLI::App::add_option<int>(this_00,&local_90,&st2,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_190,"-a",(allocator *)&gtest_ar);
  std::__cxx11::string::string(local_170,"1",(allocator *)&gtest_ar_2);
  std::__cxx11::string::string(local_150,"-b",&local_1f9);
  std::__cxx11::string::string(local_130,"2",&local_1e1);
  std::__cxx11::string::string(local_110,"-a3",&local_1e2);
  std::__cxx11::string::string(local_f0,"-a",&local_1e3);
  std::__cxx11::string::string(local_d0,"4",&local_1e4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&local_190,&local_b0);
  lVar3 = 0xc0;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&local_190._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  TApp::run(&this->super_TApp);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x3000000;
  gtest_ar_2.message_.ptr_._0_4_ = 4;
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar_2;
  CLI::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_190,__l,(allocator_type *)&local_1f9);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)&gtest_ar,"st1","std::vector<int>({1, 3, 4})",&st1,
             (vector<int,_std::allocator<int>_> *)&local_190);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_190);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3d3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ = 2;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&gtest_ar_2;
  CLI::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_190,__l_00,(allocator_type *)&local_1f9);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)&gtest_ar,"st2","std::vector<int>({2})",&st2,
             (vector<int,_std::allocator<int>_> *)&local_190);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_190);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3d4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_190;
  local_190._M_impl.super__Vector_impl_data._M_start = (pointer)pOVar1;
  local_190._M_impl.super__Vector_impl_data._M_finish = (pointer)pOVar2;
  local_190._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pOVar1;
  local_178 = pOVar1;
  CLI::std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::vector
            ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)&gtest_ar,__l_01,
             (allocator_type *)&local_1f9);
  testing::internal::
  CmpHelperEQ<std::vector<CLI::Option*,std::allocator<CLI::Option*>>,std::vector<CLI::Option*,std::allocator<CLI::Option*>>>
            ((internal *)&gtest_ar_2,"app.parse_order()",
             "std::vector<CLI::Option *>({op1, op2, op1, op1})",&(this->super_TApp).app.parse_order_
             ,(vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)&gtest_ar);
  CLI::std::_Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>::~_Vector_base
            ((_Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_190);
    if ((undefined8 *)CONCAT44(gtest_ar_2.message_.ptr_._4_4_,gtest_ar_2.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(gtest_ar_2.message_.ptr_._4_4_,gtest_ar_2.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3d6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&st2.super__Vector_base<int,_std::allocator<int>_>);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&st1.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST_F(TApp, OriginalOrder) {
    std::vector<int> st1;
    CLI::Option *op1 = app.add_option("-a", st1);
    std::vector<int> st2;
    CLI::Option *op2 = app.add_option("-b", st2);

    args = {"-a", "1", "-b", "2", "-a3", "-a", "4"};

    run();

    EXPECT_EQ(st1, std::vector<int>({1, 3, 4}));
    EXPECT_EQ(st2, std::vector<int>({2}));

    EXPECT_EQ(app.parse_order(), std::vector<CLI::Option *>({op1, op2, op1, op1}));
}